

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O3

bool_t tmDate(size_t *y,size_t *m,size_t *d)

{
  time_t tVar1;
  tm *ptVar2;
  bool_t bVar3;
  time_t et;
  tm lt;
  time_t local_60;
  tm local_58;
  
  tVar1 = time(&local_60);
  bVar3 = 0;
  if (tVar1 != -1) {
    ptVar2 = localtime_r(&local_60,&local_58);
    bVar3 = 0;
    if (ptVar2 != (tm *)0x0) {
      if (y != (size_t *)0x0) {
        *y = (long)local_58.tm_year + 0x76c;
      }
      if (m != (size_t *)0x0) {
        *m = (long)local_58.tm_mon + 1;
      }
      bVar3 = 1;
      if (d != (size_t *)0x0) {
        *d = (long)local_58.tm_mday;
      }
    }
  }
  return bVar3;
}

Assistant:

bool_t tmDate(size_t* y, size_t* m, size_t* d)
{
	struct tm lt;
	time_t et;
	// входной контроль
	ASSERT(memIsNullOrValid(y, O_PER_S));
	ASSERT(memIsNullOrValid(m, O_PER_S));
	ASSERT(memIsNullOrValid(d, O_PER_S));
	// получить отметку времени
	if (time(&et) == -1 || !localtime_r(&et, &lt))
		return FALSE;
	// возвратить данные
	if (y)
		*y = (size_t)lt.tm_year, *y += 1900;
	if (m)
		*m = (size_t)lt.tm_mon + 1;
	if (d)
		*d = (size_t)lt.tm_mday;
	return TRUE;
}